

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void walk(object *base,object *top,object *array1,object *array2,int size)

{
  object *oop;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  for (; base < top; base = (object *)((long)&base->header + (ulong)(uVar2 + 0x10))) {
    map(&base->class,array1,array2,size);
    uVar3 = base->header >> 2 & 0x3fffffff;
    iVar1 = (int)uVar3;
    if (base == array1 || base == array2) {
      uVar2 = iVar1 << 3;
    }
    else if ((base->header & 2) == 0) {
      oop = base + 1;
      while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
        map((object **)oop,array1,array2,size);
        oop = (object *)&oop->class;
      }
      uVar2 = iVar1 << 3;
    }
    else {
      uVar2 = iVar1 + 7U & 0xfffffff8;
    }
  }
  return;
}

Assistant:

static void walk(struct object *base, struct object *top,
                 struct object *array1, struct object *array2, int size)
{
    struct object *op, *opnext;
    int x, sz;

    for (op = base; op < top; op = opnext) {
        /*
         * Re-map the class pointer, in case that's the
         * object which has been remapped.
         */
        map(&op->class, array1, array2, size);

        /*
         * Skip our argument arrays, since otherwise things
         * get rather circular.
         */
        sz = SIZE(op);
        if ((op == array1) || (op == array2)) {
            opnext = WORDSUP(op, sz + 2);
            continue;
        }

        /*
         * Don't have to worry about instance variables
         * if it's a binary format.
         */
        if (IS_BINOBJ(op)) {
            int trueSize;

            /*
             * Skip size/class, and enough words to
             * contain the binary bytes.
             */
            trueSize = TO_WORDS(sz);
            opnext = WORDSUP(op, trueSize + 2);
            continue;
        }

        /*
         * For each instance variable slot, fix up the pointer
         * if needed.
         */
        for (x = 0; x < sz; ++x) {
            map(&op->data[x], array1, array2, size);
        }

        /*
         * Walk past this object
         */
        opnext = WORDSUP(op, sz + 2);
    }
}